

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O0

void __thiscall boost::deflate::detail::window::reset(window *this,int bits)

{
  int bits_local;
  window *this_local;
  
  if ((uint)this->bits_ != bits) {
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
              (&this->p_,(nullptr_t)0x0);
    this->bits_ = (uint8_t)bits;
    this->capacity_ = (uint16_t)(1 << (this->bits_ & 0x1f));
  }
  this->i_ = 0;
  this->size_ = 0;
  return;
}

Assistant:

void
    reset(int bits)
    {
        if(bits_ != bits)
        {
            p_.reset();
            bits_ = static_cast<std::uint8_t>(bits);
            capacity_ = 1U << bits_;
        }
        i_ = 0;
        size_ = 0;
    }